

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

QString * __thiscall
QProcessEnvironment::value
          (QString *__return_storage_ptr__,QProcessEnvironment *this,QString *name,
          QString *defaultValue)

{
  QProcessEnvironmentPrivate *this_00;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar1;
  Data *pDVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  Key local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00 != (QProcessEnvironmentPrivate *)0x0) {
    QProcessEnvironmentPrivate::prepareName(&local_40,this_00,name);
    pQVar1 = (this_00->vars).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      cVar3._M_node = (_Base_ptr)0x0;
    }
    else {
      cVar3 = std::
              _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QProcEnvValue>,_std::_Select1st<std::pair<const_QByteArray,_QProcEnvValue>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>
              ::find(&(pQVar1->m)._M_t,&local_40);
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
      }
    }
    pQVar1 = (((this->d).d.ptr)->vars).d.d.ptr;
    p_Var4 = (_Base_ptr)((long)&(pQVar1->m)._M_t._M_impl + 8);
    if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      p_Var4 = (_Base_ptr)0x0;
    }
    if (cVar3._M_node != p_Var4) {
      QProcEnvValue::string(__return_storage_ptr__,(QProcEnvValue *)&cVar3._M_node[1]._M_right);
      goto LAB_0041b96e;
    }
  }
  pDVar2 = (defaultValue->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
  (__return_storage_ptr__->d).size = (defaultValue->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_0041b96e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QProcessEnvironment::value(const QString &name, const QString &defaultValue) const
{
    if (!d)
        return defaultValue;

    const auto it = d->vars.constFind(d->prepareName(name));
    if (it == d->vars.constEnd())
        return defaultValue;

    return d->valueToString(it.value());
}